

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

int Aig_ManChoiceLevel(Aig_Man_t *p)

{
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  uint uVar6;
  
  pVVar4 = p->vObjs;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar3];
      if (pvVar1 != (void *)0x0) {
        if (((ulong)pvVar1 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x145,"int Aig_ObjSetLevel(Aig_Obj_t *, int)");
        }
        *(uint *)((long)pvVar1 + 0x1c) = (uint)*(byte *)((long)pvVar1 + 0x1f) << 0x18;
        pVVar4 = p->vObjs;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar4->nSize);
  }
  Aig_ManSetCioIds(p);
  Aig_ManIncrementTravId(p);
  pVVar4 = p->vCos;
  if (pVVar4->nSize < 1) {
    uVar6 = 0;
  }
  else {
    lVar3 = 0;
    uVar6 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar4->pArray[lVar3];
      Aig_ManChoiceLevel_rec(p,pAVar2);
      if (((ulong)pAVar2 & 1) != 0) goto LAB_0062bfdd;
      uVar5 = *(uint *)&pAVar2->field_0x1c & 0xffffff;
      if (uVar5 < uVar6) {
        uVar5 = uVar6;
      }
      uVar6 = uVar5;
      lVar3 = lVar3 + 1;
      pVVar4 = p->vCos;
    } while (lVar3 < pVVar4->nSize);
  }
  pVVar4 = p->vCis;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar4->pArray[lVar3];
      Aig_ManChoiceLevel_rec(p,pAVar2);
      if (((ulong)pAVar2 & 1) != 0) {
LAB_0062bfdd:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
      }
      uVar5 = *(uint *)&pAVar2->field_0x1c & 0xffffff;
      if (uVar6 <= uVar5) {
        uVar6 = uVar5;
      }
      lVar3 = lVar3 + 1;
      pVVar4 = p->vCis;
    } while (lVar3 < pVVar4->nSize);
  }
  Aig_ManCleanCioIds(p);
  return uVar6;
}

Assistant:

int Aig_ManChoiceLevel( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, LevelMax = 0;
    Aig_ManForEachObj( p, pObj, i )
        Aig_ObjSetLevel( pObj, 0 );
    Aig_ManSetCioIds( p );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachCo( p, pObj, i )
    {
        Aig_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Aig_ObjLevel(pObj) )
            LevelMax = Aig_ObjLevel(pObj);
    }
    // account for dangling boxes
    Aig_ManForEachCi( p, pObj, i )
    {
        Aig_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Aig_ObjLevel(pObj) )
            LevelMax = Aig_ObjLevel(pObj);
    }
    Aig_ManCleanCioIds( p );
//    Aig_ManForEachNode( p, pObj, i )
//        assert( Aig_ObjLevel(pObj) > 0 );
    return LevelMax;
}